

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *mat,scalar_sum_op<double> *func)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  PacketScalar adVar3;
  double adVar4 [2];
  Scalar local_e8;
  long local_e0;
  Index index_3;
  long local_d0;
  Index index_2;
  long local_c0;
  Index index_1;
  double local_a8 [2];
  double local_98 [3];
  long local_80;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  Index packetSize;
  Index size;
  scalar_sum_op<double> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  *mat_local;
  
  IVar1 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)mat);
  if (IVar1 != 0) {
    index_00 = first_aligned<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,4>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         (mat);
    lVar2 = ((IVar1 - index_00) / 2) * 2;
    index_01 = index_00 + ((IVar1 - index_00) / 4) * 4;
    if (lVar2 == 0) {
      packet_res0[1] =
           CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
           ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                    *)mat,0);
      for (local_e0 = 1; local_e0 < IVar1; local_e0 = local_e0 + 1) {
        local_e8 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                   ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                            *)mat,local_e0);
        packet_res0[1] = scalar_sum_op<double>::operator()(func,packet_res0 + 1,&local_e8);
      }
    }
    else {
      adVar3 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
               ::packet<1>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                            *)mat,index_00);
      packet_res1[1] = adVar3[0];
      if (2 < lVar2) {
        adVar3 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                 ::packet<1>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                              *)mat,index_00 + 2);
        index = adVar3[0];
        local_80 = index_00;
        while (local_80 = local_80 + 4, local_80 < index_01) {
          adVar3 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                   ::packet<1>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                                *)mat,local_80);
          local_98[0] = adVar3[0];
          adVar4 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (func,(double (*) [2])(packet_res1 + 1),(double (*) [2])local_98);
          packet_res1[1] = adVar4[0];
          adVar3 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                   ::packet<1>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                                *)mat,local_80 + 2);
          local_a8[0] = adVar3[0];
          adVar4 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (func,(double (*) [2])&index,&local_a8);
          index = adVar4[0];
        }
        adVar4 = scalar_sum_op<double>::packetOp<double__vector(2)>
                           (func,(double (*) [2])(packet_res1 + 1),(double (*) [2])&index);
        packet_res1[1] = adVar4[0];
        if (index_01 < index_00 + lVar2) {
          adVar3 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                   ::packet<1>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                                *)mat,index_01);
          index_1 = adVar3[0];
          adVar4 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (func,(double (*) [2])(packet_res1 + 1),(double (*) [2])&index_1);
          packet_res1[1] = adVar4[0];
        }
      }
      packet_res0[1] =
           scalar_sum_op<double>::predux<double__vector(2)>(func,(double (*) [2])(packet_res1 + 1));
      for (local_c0 = 0; local_d0 = index_00 + lVar2, local_c0 < index_00; local_c0 = local_c0 + 1)
      {
        index_2 = (Index)CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                         ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                                  *)mat,local_c0);
        packet_res0[1] = scalar_sum_op<double>::operator()(func,packet_res0 + 1,(double *)&index_2);
      }
      for (; local_d0 < IVar1; local_d0 = local_d0 + 1) {
        index_3 = (Index)CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Dense>
                         ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Dense>
                                  *)mat,local_d0);
        packet_res0[1] = scalar_sum_op<double>::operator()(func,packet_res0 + 1,(double *)&index_3);
      }
    }
    return packet_res0[1];
  }
  __assert_fail("size && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Redux.h"
                ,0xca,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>, Traversal = 3, Unrolling = 0]"
               );
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }